

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_timestamp
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  ushort uVar1;
  element_type *peVar2;
  ImageObject *pIVar3;
  ulong i;
  bool bVar4;
  bool bVar5;
  ulonglong uVar6;
  Atom *pAVar7;
  uint16_t *puVar8;
  undefined7 in_register_00000011;
  int iVar9;
  string *psVar10;
  Atom local_124 [4];
  ulong local_120;
  uint local_118;
  undefined4 local_114;
  char *p_1;
  string number;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_88;
  Class local_78;
  
  local_114 = (undefined4)CONCAT71(in_register_00000011,enforce);
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  puVar8 = extent_index;
  bVar4 = read_nil_us(this,(Ptr *)&local_88,write_index,extent_index,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  if (bVar4) {
    return true;
  }
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  Class::Class(&local_78,TIMESTAMP);
  bVar4 = read_variable(this,(Ptr *)&local_e8,write_index,puVar8,write,&local_78);
  Class::~Class(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  if (!bVar4) {
    local_120 = (ulong)write_index;
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
    ;
    puVar8 = extent_index;
    bVar4 = read_reference(this,(Ptr *)&local_98,(uint16_t)local_120,extent_index,write,TIMESTAMP);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    if (!bVar4) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a8,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar4 = read_wildcard(this,(Ptr *)&local_a8,(uint16_t)local_120,puVar8,write);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      if (!bVar4) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar4 = read_tail_wildcard(this,(Ptr *)&local_b8,(uint16_t)local_120,puVar8,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
        if (!bVar4) {
          peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          std::__cxx11::string::string((string *)&number,"us",(allocator *)&p_1);
          bVar4 = r_code::Utils::EndsWith(&peVar2->cmd,&number);
          std::__cxx11::string::~string((string *)&number);
          if (bVar4) {
            psVar10 = &((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->cmd;
            std::__cxx11::string::find((char *)psVar10,0x146d43);
            std::__cxx11::string::substr((ulong)&number,(ulong)psVar10);
            uVar6 = strtoull(number._M_dataplus._M_p,&p_1,10);
            i = local_120;
            if (*p_1 == '\0') {
              if (write) {
                r_code::Atom::IPointer((ushort)local_124);
                pAVar7 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(this->current_object + 8),i);
                r_code::Atom::operator=(pAVar7,local_124);
                r_code::Atom::~Atom(local_124);
                r_code::Atom::Timestamp();
                pIVar3 = this->current_object;
                uVar1 = *extent_index;
                *extent_index = uVar1 + 1;
                pAVar7 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar7,local_124);
                r_code::Atom::~Atom(local_124);
                r_code::Atom::Atom(local_124,(uint)(uVar6 >> 0x20));
                pIVar3 = this->current_object;
                uVar1 = *extent_index;
                *extent_index = uVar1 + 1;
                pAVar7 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar7,local_124);
                r_code::Atom::~Atom(local_124);
                r_code::Atom::Atom(local_124,(uint)uVar6);
                pIVar3 = this->current_object;
                uVar1 = *extent_index;
                *extent_index = uVar1 + 1;
                pAVar7 = r_code::vector<r_code::Atom>::operator[]
                                   ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
                r_code::Atom::operator=(pAVar7,local_124);
                r_code::Atom::~Atom(local_124);
              }
              std::__cxx11::string::~string((string *)&number);
              return true;
            }
            std::__cxx11::string::~string((string *)&number);
          }
          local_118 = (uint)(this->state).pattern_lvl;
          bVar4 = (this->state).no_arity_check;
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_c8,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          bVar5 = expression(this,(Ptr *)&local_c8,TIMESTAMP,(uint16_t)local_120,extent_index,write)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
          if (!bVar5) {
            iVar9 = (uint)bVar4 * 0x10000 + local_118;
            (this->state).pattern_lvl = (uint16_t)iVar9;
            (this->state).no_arity_check = SUB41((uint)iVar9 >> 0x10,0);
            if ((char)local_114 != '\0') {
              std::__cxx11::string::string
                        ((string *)&number,
                         " error: expected a timestamp or an expr evaluating to a timestamp",
                         (allocator *)&p_1);
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_d8,
                         &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
              ;
              set_error(this,&number,(Ptr *)&local_d8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_d8._M_refcount);
              std::__cxx11::string::~string((string *)&number);
            }
            return false;
          }
          return true;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Compiler::read_timestamp(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (read_nil_us(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, TIMESTAMP)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, TIMESTAMP)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (Utils::EndsWith(node->cmd, "us")) {
        std::string number = node->cmd.substr(0, node->cmd.find("us"));

        try {
            char *p;
            uint64_t ts = std::strtoull(number.c_str(), &p, 10);

            if (*p == 0) {
                if (write) {
                    current_object->code[write_index] = Atom::IPointer(extent_index);
                    current_object->code[extent_index++] = Atom::Timestamp();
                    current_object->code[extent_index++] = ts >> 32;
                    current_object->code[extent_index++] = (ts & UINT32_MAX);
                }

                return true;
            }
        } catch (const std::invalid_argument &ia) { }
    } else {
    }

    State s = save_state();

    if (expression(node, TIMESTAMP, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a timestamp or an expr evaluating to a timestamp", node);
        return false;
    }

    return false;
}